

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::builtins::DumpVarsTask::bindArgument
          (DumpVarsTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  string_view arg;
  bool bVar1;
  InvalidExpression *pIVar2;
  BumpAllocator *this_00;
  Symbol *pSVar3;
  VariableSymbol *pVVar4;
  Expression *pEVar5;
  SyntaxNode *in_RCX;
  SourceLocation in_RDX;
  long in_RSI;
  SystemSubroutine *in_RDI;
  Symbol *sym;
  Expression *ref;
  Compilation *comp;
  ASTContext *in_stack_00000230;
  NameSyntax *in_stack_00000238;
  Compilation *in_stack_00000240;
  bitmask<slang::ast::LookupFlags> in_stack_0000024c;
  Type *in_stack_ffffffffffffff10;
  Compilation *args_1;
  void **in_stack_ffffffffffffff18;
  Compilation *args_00;
  Args *in_stack_ffffffffffffff20;
  ASTContext *in_stack_ffffffffffffff28;
  SourceLocation this_01;
  SourceLocation in_stack_ffffffffffffff30;
  SourceLocation in_stack_ffffffffffffff38;
  DiagCode code;
  Scope *in_stack_ffffffffffffff48;
  SourceLocation SVar6;
  SyntaxNode *in_stack_ffffffffffffff60;
  SourceLocation SVar7;
  bitmask<slang::ast::LookupFlags> local_64;
  Expression *local_60;
  undefined8 local_58;
  SourceRange local_50;
  undefined4 local_3c;
  Compilation *local_38;
  SyntaxNode *local_28;
  SourceLocation local_20;
  
  if (in_RSI == 0) {
    pEVar5 = SystemSubroutine::bindArgument
                       (in_RDI,(size_t)in_stack_ffffffffffffff38,
                        (ASTContext *)in_stack_ffffffffffffff30,
                        (ExpressionSyntax *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    return pEVar5;
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_38 = ASTContext::getCompilation((ASTContext *)0x7c1b28);
  code = SUB84((ulong)in_RDI >> 0x20,0);
  bVar1 = slang::syntax::NameSyntax::isKind(local_28->kind);
  if (!bVar1) {
    local_3c = 0x9000b;
    local_50 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff60);
    sourceRange.endLoc = in_stack_ffffffffffffff38;
    sourceRange.startLoc = local_20;
    ASTContext::addDiag(in_stack_ffffffffffffff28,code,sourceRange);
    local_58 = 0;
    Compilation::getErrorType(local_38);
    pIVar2 = BumpAllocator::
             emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                       ((BumpAllocator *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                        in_stack_ffffffffffffff10);
    return &pIVar2->super_Expression;
  }
  args_00 = local_38;
  this_00 = (BumpAllocator *)slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(local_28);
  memset(&local_64,0,4);
  bitmask<slang::ast::LookupFlags>::bitmask(&local_64);
  local_60 = ArbitrarySymbolExpression::fromSyntax
                       (in_stack_00000240,in_stack_00000238,in_stack_00000230,in_stack_0000024c);
  if (local_60->kind == ArbitrarySymbol) {
    Expression::as<slang::ast::ArbitrarySymbolExpression>(local_60);
    pSVar3 = not_null<const_slang::ast::Symbol_*>::operator*
                       ((not_null<const_slang::ast::Symbol_*> *)0x7c1c81);
    this_01 = local_20;
    if ((pSVar3->kind != Variable) && (pSVar3->kind != Net)) {
      if (pSVar3->kind != Instance) {
LAB_007c1cd5:
        not_null<const_slang::ast::Scope_*>::operator->
                  ((not_null<const_slang::ast::Scope_*> *)0x7c1ce2);
        bVar1 = Scope::isUninstantiated(in_stack_ffffffffffffff48);
        if (!bVar1) {
          sourceRange_00.endLoc = in_stack_ffffffffffffff38;
          sourceRange_00.startLoc = in_stack_ffffffffffffff30;
          ASTContext::addDiag((ASTContext *)local_20,code,sourceRange_00);
        }
        args_1 = local_38;
        Compilation::getErrorType(local_38);
        pIVar2 = BumpAllocator::
                 emplace<slang::ast::InvalidExpression,slang::ast::Expression*,slang::ast::Type_const&>
                           (this_00,(Expression **)args_00,(Type *)args_1);
        return &pIVar2->super_Expression;
      }
      Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x7c1cc5);
      bVar1 = InstanceSymbol::isModule((InstanceSymbol *)0x7c1ccd);
      this_01 = local_20;
      if (!bVar1) goto LAB_007c1cd5;
    }
    bVar1 = VariableSymbol::isKind(pSVar3->kind);
    if ((bVar1) &&
       (pVVar4 = Symbol::as<slang::ast::VariableSymbol>((Symbol *)0x7c1d9e),
       pVVar4->lifetime == Automatic)) {
      SVar6 = (local_60->sourceRange).startLoc;
      SVar7 = (local_60->sourceRange).endLoc;
      sourceRange_01.endLoc = in_stack_ffffffffffffff38;
      sourceRange_01.startLoc = in_stack_ffffffffffffff30;
      ASTContext::addDiag((ASTContext *)this_01,code,sourceRange_01);
      arg._M_str = (char *)SVar7;
      arg._M_len = (size_t)SVar6;
      Diagnostic::operator<<((Diagnostic *)(pSVar3->name)._M_str,arg);
    }
  }
  return local_60;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex > 0) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModOrVarName, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            auto& ref = ArbitrarySymbolExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                              context);

            if (ref.kind == ExpressionKind::ArbitrarySymbol) {
                auto& sym = *ref.as<ArbitrarySymbolExpression>().symbol;
                if (sym.kind != SymbolKind::Variable && sym.kind != SymbolKind::Net &&
                    (sym.kind != SymbolKind::Instance || !sym.as<InstanceSymbol>().isModule())) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedModOrVarName, ref.sourceRange);
                    return *comp.emplace<InvalidExpression>(&ref, comp.getErrorType());
                }
                else if (VariableSymbol::isKind(sym.kind) &&
                         sym.as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                    context.addDiag(diag::AutoVarTraced, ref.sourceRange) << sym.name;
                }
            }

            return ref;
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }